

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

void __thiscall
soul::ResolutionPass::ResolutionPass(ResolutionPass *this,Allocator *a,ModuleBase *m)

{
  string local_90;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_70;
  
  this->allocator = a;
  this->module = m;
  (this->intrinsicsNamespacePath).pathSections.items =
       (Identifier *)(this->intrinsicsNamespacePath).pathSections.space;
  (this->intrinsicsNamespacePath).pathSections.numActive = 0;
  (this->intrinsicsNamespacePath).pathSections.numAllocated = 8;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"soul::intrinsics","");
  IdentifierPath::fromString((IdentifierPath *)&local_70,&a->identifiers,&local_90);
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
            (&(this->intrinsicsNamespacePath).pathSections,&local_70);
  local_70.numActive = 0;
  if (8 < local_70.numAllocated) {
    if (local_70.items != (Identifier *)0x0) {
      operator_delete__(local_70.items);
    }
    local_70.items = (Identifier *)local_70.space;
    local_70.numAllocated = 8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ResolutionPass (AST::Allocator& a, AST::ModuleBase& m) : allocator (a), module (m)
    {
        intrinsicsNamespacePath = IdentifierPath::fromString (allocator.identifiers, getIntrinsicsNamespaceName());
    }